

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryRequirementsTests.cpp
# Opt level: O0

void vkt::memory::anon_unknown_0::populateTestGroup(TestCaseGroup *group)

{
  uint uVar1;
  char *__s;
  ImageParams arg0;
  TestCaseGroup *pTVar2;
  TestContext *pTVar3;
  TestNode *pTVar4;
  vkt *this;
  bool bVar5;
  undefined8 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 uVar6;
  undefined4 uStack_3ac;
  allocator<char> local_331;
  string local_330;
  undefined1 local_310 [48];
  ostringstream caseName;
  ImageParams params;
  int tilingNdx;
  int flagsNdx;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> imageGroup;
  anon_struct_16_3_41928a1a imageFlagsCases [6];
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  int local_8c;
  DefaultDeleter<tcu::TestCaseGroup> local_85;
  int ndx;
  undefined1 local_78 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> bufferGroup;
  anon_struct_16_2_ec87c39b bufferCases [5];
  TestCaseGroup *group_local;
  
  bufferCases[3].name = (char *)0x7;
  bufferCases[4]._0_8_ = anon_var_dwarf_846d31;
  bufferCases[2].name = (char *)0x5;
  bufferCases[3]._0_8_ = anon_var_dwarf_846d1a;
  bufferCases[1].name = (char *)0x3;
  bufferCases[2]._0_8_ = (long)"image_sparse_residency" + 6;
  bufferCases[0].name = (char *)0x1;
  bufferCases[1]._0_8_ = (long)"%type_image_sparse" + 0xc;
  bufferGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _8_8_ = 0;
  bufferCases[0]._0_8_ = anon_var_dwarf_846cd5;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  pTVar3 = tcu::TestNode::getTestContext(&group->super_TestNode);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,pTVar3,"buffer","");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_85);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_78,pTVar2
            );
  for (local_8c = 0; local_8c < 5; local_8c = local_8c + 1) {
    pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_78
                );
    __s = *(char **)(bufferCases + local_8c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,__s,&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_d9);
    addFunctionCase<unsigned_int>
              (pTVar2,&local_b0,&local_d8,testBuffer,*(uint *)&bufferCases[(long)local_8c + -1].name
              );
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
  }
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_78
                   )->super_TestNode;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar4);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_78);
  imageFlagsCases[4].name = (char *)0x7;
  imageFlagsCases[5]._0_8_ = anon_var_dwarf_846d31;
  imageFlagsCases[3].name = (char *)0x5;
  imageFlagsCases[4]._0_8_ = anon_var_dwarf_846d1a;
  imageFlagsCases[2].name = (char *)0x3;
  imageFlagsCases[3]._0_8_ = (long)"image_sparse_residency" + 6;
  imageFlagsCases[1].name = (char *)0x1;
  imageFlagsCases[2]._0_8_ = (long)"%type_image_sparse" + 0xc;
  imageFlagsCases[0].name = (char *)0x100000000;
  imageFlagsCases[1]._0_8_ = (long)"command_pool_transient" + 0xd;
  imageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _8_8_ = 0;
  imageFlagsCases[0]._0_8_ = anon_var_dwarf_846cd5;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  pTVar3 = tcu::TestNode::getTestContext(&group->super_TestNode);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,pTVar3,"image","");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&tilingNdx + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&flagsNdx,
             pTVar2);
  params.transient = false;
  params._9_3_ = 0;
  for (; (int)params._8_4_ < 6; params._8_4_ = params._8_4_ + 1) {
    for (params.tiling = VK_IMAGE_TILING_OPTIMAL; (int)params.tiling < 2;
        params.tiling = params.tiling + VK_IMAGE_TILING_LINEAR) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_310 + 0x28));
      uVar1 = *(uint *)&imageFlagsCases[(long)(int)params._8_4_ + -1].name;
      std::operator<<((ostream *)(local_310 + 0x28),*(char **)(imageFlagsCases + (int)params._8_4_))
      ;
      bVar5 = params.tiling == VK_IMAGE_TILING_OPTIMAL;
      if (bVar5) {
        std::operator<<((ostream *)(local_310 + 0x28),"_tiling_linear");
      }
      else {
        std::operator<<((ostream *)(local_310 + 0x28),"_tiling_optimal");
      }
      if (((uVar1 & 2) == 0) || (!bVar5)) {
        this = (vkt *)de::details::
                      UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                                ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                  *)&flagsNdx);
        std::__cxx11::ostringstream::str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"",&local_331);
        arg0._8_4_ = in_stack_fffffffffffffc50;
        arg0.flags = (int)in_stack_fffffffffffffc48;
        arg0.tiling = (int)((ulong)in_stack_fffffffffffffc48 >> 0x20);
        addFunctionCase<vkt::memory::(anonymous_namespace)::ImageParams>
                  (this,(TestCaseGroup *)local_310,&local_330,(string *)testImage,
                   (Function)(ulong)CONCAT14(bVar5,uVar1),arg0);
        std::__cxx11::string::~string((string *)&local_330);
        std::allocator<char>::~allocator(&local_331);
        std::__cxx11::string::~string((string *)local_310);
        local_310._36_4_ = 0;
      }
      else {
        local_310._36_4_ = 10;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_310 + 0x28));
    }
  }
  uVar6 = SUB84(group,0);
  uStack_3ac = (undefined4)((ulong)group >> 0x20);
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &flagsNdx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)CONCAT44(uStack_3ac,uVar6),pTVar4);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&flagsNdx);
  return;
}

Assistant:

void populateTestGroup (tcu::TestCaseGroup* group)
{
	// Buffers
	{
		const struct
		{
			VkBufferCreateFlags		flags;
			const char* const		name;
		} bufferCases[] =
		{
			{ (VkBufferCreateFlags)0,																								"regular"					},
			{ VK_BUFFER_CREATE_SPARSE_BINDING_BIT,																					"sparse"					},
			{ VK_BUFFER_CREATE_SPARSE_BINDING_BIT | VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT,											"sparse_residency"			},
			{ VK_BUFFER_CREATE_SPARSE_BINDING_BIT											| VK_BUFFER_CREATE_SPARSE_ALIASED_BIT,	"sparse_aliased"			},
			{ VK_BUFFER_CREATE_SPARSE_BINDING_BIT | VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT	| VK_BUFFER_CREATE_SPARSE_ALIASED_BIT,	"sparse_residency_aliased"	},
		};

		de::MovePtr<tcu::TestCaseGroup> bufferGroup(new tcu::TestCaseGroup(group->getTestContext(), "buffer", ""));

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(bufferCases); ++ndx)
			addFunctionCase(bufferGroup.get(), bufferCases[ndx].name, "", testBuffer, bufferCases[ndx].flags);

		group->addChild(bufferGroup.release());
	}

	// Images
	{
		const struct
		{
			VkImageCreateFlags		flags;
			bool					transient;
			const char* const		name;
		} imageFlagsCases[] =
		{
			{ (VkImageCreateFlags)0,																								false,	"regular"					},
			{ (VkImageCreateFlags)0,																								true,	"transient"					},
			{ VK_IMAGE_CREATE_SPARSE_BINDING_BIT,																					false,	"sparse"					},
			{ VK_IMAGE_CREATE_SPARSE_BINDING_BIT | VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT,											false,	"sparse_residency"			},
			{ VK_IMAGE_CREATE_SPARSE_BINDING_BIT											| VK_IMAGE_CREATE_SPARSE_ALIASED_BIT,	false,	"sparse_aliased"			},
			{ VK_IMAGE_CREATE_SPARSE_BINDING_BIT | VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT		| VK_IMAGE_CREATE_SPARSE_ALIASED_BIT,	false,	"sparse_residency_aliased"	},
		};

		de::MovePtr<tcu::TestCaseGroup> imageGroup(new tcu::TestCaseGroup(group->getTestContext(), "image", ""));

		for (int flagsNdx = 0; flagsNdx < DE_LENGTH_OF_ARRAY(imageFlagsCases); ++flagsNdx)
		for (int tilingNdx = 0; tilingNdx <= 1; ++tilingNdx)
		{
			ImageParams			params;
			std::ostringstream	caseName;

			params.flags		=  imageFlagsCases[flagsNdx].flags;
			params.transient	=  imageFlagsCases[flagsNdx].transient;
			caseName			<< imageFlagsCases[flagsNdx].name;

			if (tilingNdx != 0)
			{
				params.tiling =  VK_IMAGE_TILING_OPTIMAL;
				caseName      << "_tiling_optimal";
			}
			else
			{
				params.tiling =  VK_IMAGE_TILING_LINEAR;
				caseName      << "_tiling_linear";
			}

			if ((params.flags & VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT) && (params.tiling == VK_IMAGE_TILING_LINEAR))
				continue;

			addFunctionCase(imageGroup.get(), caseName.str(), "", testImage, params);
		}

		group->addChild(imageGroup.release());
	}
}